

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunks
          (BamStandardIndex *this,BaiAlignmentChunkVector *chunks)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  undefined8 uVar4;
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  *in_RSI;
  long in_RDI;
  const_iterator chunkEnd;
  const_iterator chunkIter;
  int64_t numBytesWritten;
  int32_t chunkCount;
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  *in_stack_ffffffffffffff38;
  __normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  *in_stack_ffffffffffffff40;
  allocator *paVar5;
  string *in_stack_ffffffffffffff70;
  __normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 uVar6;
  allocator in_stack_ffffffffffffff87;
  BaiAlignmentChunkVector *in_stack_ffffffffffffff88;
  BamStandardIndex *in_stack_ffffffffffffff90;
  allocator local_41;
  string local_40 [8];
  BaiAlignmentChunk *in_stack_ffffffffffffffc8;
  BamStandardIndex *in_stack_ffffffffffffffd0;
  int32_t local_14;
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  *local_10;
  
  local_10 = in_RSI;
  MergeAlignmentChunks(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar2 = std::
          vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
          ::size(local_10);
  local_14 = (int32_t)sVar2;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(&local_14);
  }
  lVar3 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),&local_14,4);
  if (lVar3 != 4) {
    uVar6 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamStandardIndex::WriteAlignmentChunks",&local_41);
    paVar5 = (allocator *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,"could not write BAI chunk count",paVar5);
    BamException::BamException
              ((BamException *)
               CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar6,in_stack_ffffffffffffff80)),
               (string *)in_stack_ffffffffffffff78._M_current,in_stack_ffffffffffffff70);
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  std::
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ::begin(in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<BamTools::Internal::BaiAlignmentChunk_const*,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>
  ::__normal_iterator<BamTools::Internal::BaiAlignmentChunk*>
            (in_stack_ffffffffffffff40,
             (__normal_iterator<BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
              *)in_stack_ffffffffffffff38);
  std::
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ::end(in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<BamTools::Internal::BaiAlignmentChunk_const*,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>
  ::__normal_iterator<BamTools::Internal::BaiAlignmentChunk*>
            (in_stack_ffffffffffffff40,
             (__normal_iterator<BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff40,
                       (__normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
    ::operator*((__normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
                 *)&stack0xffffffffffffff78);
    WriteAlignmentChunk(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
    ::operator++((__normal_iterator<const_BamTools::Internal::BaiAlignmentChunk_*,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
                  *)&stack0xffffffffffffff78);
  }
  return;
}

Assistant:

void BamStandardIndex::WriteAlignmentChunks(BaiAlignmentChunkVector& chunks)
{

    // make sure chunks are merged (simplified) before writing & saving summary
    MergeAlignmentChunks(chunks);

    // write chunks
    int32_t chunkCount = chunks.size();
    if (m_isBigEndian) SwapEndian_32(chunkCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&chunkCount, sizeof(chunkCount));
    if (numBytesWritten != sizeof(chunkCount))
        throw BamException("BamStandardIndex::WriteAlignmentChunks",
                           "could not write BAI chunk count");

    // iterate over chunks
    BaiAlignmentChunkVector::const_iterator chunkIter = chunks.begin();
    BaiAlignmentChunkVector::const_iterator chunkEnd = chunks.end();
    for (; chunkIter != chunkEnd; ++chunkIter)
        WriteAlignmentChunk((*chunkIter));
}